

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlcatalog.c
# Opt level: O0

void usershell(void)

{
  int iVar1;
  char *__ptr;
  long lVar2;
  bool bVar3;
  xmlChar *ans;
  int ret;
  int i;
  char *argv [20];
  char arg [400];
  char command [100];
  int local_1c;
  char **ppcStack_18;
  int nbargs;
  char *cur;
  char *cmdline;
  
  while( true ) {
    while( true ) {
      __ptr = xmlShellReadline("> ");
      ppcStack_18 = (char **)__ptr;
      if (__ptr == (char *)0x0) {
        return;
      }
      while( true ) {
        bVar3 = true;
        if (*(char *)ppcStack_18 != ' ') {
          bVar3 = *(char *)ppcStack_18 == '\t';
        }
        if (!bVar3) break;
        ppcStack_18 = (char **)((long)ppcStack_18 + 1);
      }
      ans._4_4_ = 0;
      while( true ) {
        bVar3 = false;
        if (((*(char *)ppcStack_18 != ' ') && (bVar3 = false, *(char *)ppcStack_18 != '\t')) &&
           (bVar3 = false, *(char *)ppcStack_18 != '\n')) {
          bVar3 = *(char *)ppcStack_18 != '\r';
        }
        if ((!bVar3) || (*(char *)ppcStack_18 == '\0')) break;
        arg[(long)ans._4_4_ + 0x188] = *(char *)ppcStack_18;
        ans._4_4_ = ans._4_4_ + 1;
        ppcStack_18 = (char **)((long)ppcStack_18 + 1);
      }
      arg[(long)ans._4_4_ + 0x188] = '\0';
      if (ans._4_4_ != 0) break;
      free(__ptr);
    }
    memset(argv + 0x13,0,400);
    while( true ) {
      bVar3 = true;
      if (*(char *)ppcStack_18 != ' ') {
        bVar3 = *(char *)ppcStack_18 == '\t';
      }
      if (!bVar3) break;
      ppcStack_18 = (char **)((long)ppcStack_18 + 1);
    }
    ans._4_4_ = 0;
    while( true ) {
      bVar3 = false;
      if ((*(char *)ppcStack_18 != '\n') && (bVar3 = false, *(char *)ppcStack_18 != '\r')) {
        bVar3 = *(char *)ppcStack_18 != '\0';
      }
      if ((!bVar3) || (*(char *)ppcStack_18 == '\0')) break;
      *(char *)((long)argv + (long)ans._4_4_ + 0x98) = *(char *)ppcStack_18;
      ans._4_4_ = ans._4_4_ + 1;
      ppcStack_18 = (char **)((long)ppcStack_18 + 1);
    }
    *(undefined1 *)((long)argv + (long)ans._4_4_ + 0x98) = 0;
    ans._4_4_ = 0;
    local_1c = 0;
    ppcStack_18 = argv + 0x13;
    memset(&ret,0,0xa0);
    while (*(char *)ppcStack_18 != '\0') {
      while( true ) {
        bVar3 = true;
        if (*(char *)ppcStack_18 != ' ') {
          bVar3 = *(char *)ppcStack_18 == '\t';
        }
        if (!bVar3) break;
        ppcStack_18 = (char **)((long)ppcStack_18 + 1);
      }
      if (*(char *)ppcStack_18 == '\'') {
        ppcStack_18 = (char **)((long)ppcStack_18 + 1);
        *(char ***)(&ret + (long)ans._4_4_ * 2) = ppcStack_18;
        while( true ) {
          bVar3 = false;
          if (*(char *)ppcStack_18 != '\0') {
            bVar3 = *(char *)ppcStack_18 != '\'';
          }
          if (!bVar3) break;
          ppcStack_18 = (char **)((long)ppcStack_18 + 1);
        }
        if (*(char *)ppcStack_18 == '\'') {
          *(char *)ppcStack_18 = '\0';
          local_1c = local_1c + 1;
          ans._4_4_ = ans._4_4_ + 1;
          ppcStack_18 = (char **)((long)ppcStack_18 + 1);
        }
      }
      else if (*(char *)ppcStack_18 == '\"') {
        ppcStack_18 = (char **)((long)ppcStack_18 + 1);
        *(char ***)(&ret + (long)ans._4_4_ * 2) = ppcStack_18;
        while( true ) {
          bVar3 = false;
          if (*(char *)ppcStack_18 != '\0') {
            bVar3 = *(char *)ppcStack_18 != '\"';
          }
          if (!bVar3) break;
          ppcStack_18 = (char **)((long)ppcStack_18 + 1);
        }
        if (*(char *)ppcStack_18 == '\"') {
          *(char *)ppcStack_18 = '\0';
          local_1c = local_1c + 1;
          ans._4_4_ = ans._4_4_ + 1;
          ppcStack_18 = (char **)((long)ppcStack_18 + 1);
        }
      }
      else {
        *(char ***)(&ret + (long)ans._4_4_ * 2) = ppcStack_18;
        while( true ) {
          bVar3 = false;
          if ((*(char *)ppcStack_18 != '\0') && (bVar3 = false, *(char *)ppcStack_18 != ' ')) {
            bVar3 = *(char *)ppcStack_18 != '\t';
          }
          if (!bVar3) break;
          ppcStack_18 = (char **)((long)ppcStack_18 + 1);
        }
        *(char *)ppcStack_18 = '\0';
        local_1c = local_1c + 1;
        ans._4_4_ = ans._4_4_ + 1;
        ppcStack_18 = (char **)((long)ppcStack_18 + 1);
      }
    }
    iVar1 = strcmp(arg + 0x188,"exit");
    if (((iVar1 == 0) || (iVar1 = strcmp(arg + 0x188,"quit"), iVar1 == 0)) ||
       (iVar1 = strcmp(arg + 0x188,"bye"), iVar1 == 0)) break;
    iVar1 = strcmp(arg + 0x188,"public");
    if (iVar1 == 0) {
      if (local_1c == 1) {
        lVar2 = xmlCatalogResolvePublic(_ret);
        if (lVar2 == 0) {
          printf("No entry for PUBLIC %s\n");
        }
        else {
          printf("%s\n");
          (*_xmlFree)(lVar2);
        }
      }
      else {
        printf("public requires 1 arguments\n");
      }
    }
    else {
      iVar1 = strcmp(arg + 0x188,"system");
      if (iVar1 == 0) {
        if (local_1c == 1) {
          lVar2 = xmlCatalogResolveSystem(_ret);
          if (lVar2 == 0) {
            printf("No entry for SYSTEM %s\n");
          }
          else {
            printf("%s\n");
            (*_xmlFree)(lVar2);
          }
        }
        else {
          printf("system requires 1 arguments\n");
        }
      }
      else {
        iVar1 = strcmp(arg + 0x188,"add");
        if (iVar1 == 0) {
          if (sgml == 0) {
            if ((local_1c == 3) || (local_1c == 2)) {
              if (argv[1] == (char *)0x0) {
                ans._0_4_ = xmlCatalogAdd(_ret,0,argv[0]);
              }
              else {
                ans._0_4_ = xmlCatalogAdd(_ret,argv[0],argv[1]);
              }
              if ((int)ans != 0) {
                printf("add command failed\n");
              }
            }
            else {
              printf("add requires 2 or 3 arguments\n");
            }
          }
          else if ((local_1c == 3) || (local_1c == 2)) {
            if (argv[1] == (char *)0x0) {
              ans._0_4_ = xmlCatalogAdd(_ret,0,argv[0]);
            }
            else {
              ans._0_4_ = xmlCatalogAdd(_ret,argv[0],argv[1]);
            }
            if ((int)ans != 0) {
              printf("add command failed\n");
            }
          }
          else {
            printf("add requires 2 or 3 arguments\n");
          }
        }
        else {
          iVar1 = strcmp(arg + 0x188,"del");
          if (iVar1 == 0) {
            if (local_1c == 1) {
              iVar1 = xmlCatalogRemove(_ret);
              if (iVar1 < 1) {
                printf("del command failed\n");
              }
            }
            else {
              printf("del requires 1\n");
            }
          }
          else {
            iVar1 = strcmp(arg + 0x188,"resolve");
            if (iVar1 == 0) {
              if (local_1c == 2) {
                lVar2 = xmlCatalogResolve(_ret);
                if (lVar2 == 0) {
                  printf("Resolver failed to find an answer\n");
                }
                else {
                  printf("%s\n");
                  (*_xmlFree)(lVar2);
                }
              }
              else {
                printf("resolve requires 2 arguments\n");
              }
            }
            else {
              iVar1 = strcmp(arg + 0x188,"dump");
              if (iVar1 == 0) {
                if (local_1c == 0) {
                  xmlCatalogDump(_stdout);
                }
                else {
                  printf("dump has no arguments\n");
                }
              }
              else {
                iVar1 = strcmp(arg + 0x188,"debug");
                if (iVar1 == 0) {
                  if (local_1c == 0) {
                    verbose = verbose + 1;
                    xmlCatalogSetDebug(verbose);
                  }
                  else {
                    printf("debug has no arguments\n");
                  }
                }
                else {
                  iVar1 = strcmp(arg + 0x188,"quiet");
                  if (iVar1 == 0) {
                    if (local_1c == 0) {
                      if (0 < verbose) {
                        verbose = verbose + -1;
                      }
                      xmlCatalogSetDebug(verbose);
                    }
                    else {
                      printf("quiet has no arguments\n");
                    }
                  }
                  else {
                    iVar1 = strcmp(arg + 0x188,"help");
                    if (iVar1 != 0) {
                      printf("Unrecognized command %s\n");
                    }
                    printf("Commands available:\n");
                    printf("\tpublic PublicID: make a PUBLIC identifier lookup\n");
                    printf("\tsystem SystemID: make a SYSTEM identifier lookup\n");
                    printf("\tresolve PublicID SystemID: do a full resolver lookup\n");
                    printf("\tadd \'type\' \'orig\' \'replace\' : add an entry\n");
                    printf("\tdel \'values\' : remove values\n");
                    printf("\tdump: print the current catalog state\n");
                    printf("\tdebug: increase the verbosity level\n");
                    printf("\tquiet: decrease the verbosity level\n");
                    printf("\texit:  quit the shell\n");
                  }
                }
              }
            }
          }
        }
      }
    }
    free(__ptr);
  }
  free(__ptr);
  return;
}

Assistant:

static void usershell(void) {
    char *cmdline = NULL, *cur;
    int nbargs;
    char command[100];
    char arg[400];
    char *argv[20];
    int i, ret;
    xmlChar *ans;

    while (1) {
	cmdline = xmlShellReadline("> ");
	if (cmdline == NULL)
	    return;

	/*
	 * Parse the command itself
	 */
	cur = cmdline;
	nbargs = 0;
	while ((*cur == ' ') || (*cur == '\t')) cur++;
	i = 0;
	while ((*cur != ' ') && (*cur != '\t') &&
	       (*cur != '\n') && (*cur != '\r')) {
	    if (*cur == 0)
		break;
	    command[i++] = *cur++;
	}
	command[i] = 0;
	if (i == 0) {
	    free(cmdline);
	    continue;
	}

	/*
	 * Parse the argument string
	 */
	memset(arg, 0, sizeof(arg));
	while ((*cur == ' ') || (*cur == '\t')) cur++;
	i = 0;
	while ((*cur != '\n') && (*cur != '\r') && (*cur != 0)) {
	    if (*cur == 0)
		break;
	    arg[i++] = *cur++;
	}
	arg[i] = 0;

	/*
	 * Parse the arguments
	 */
	i = 0;
	nbargs = 0;
	cur = arg;
	memset(argv, 0, sizeof(argv));
	while (*cur != 0) {
	    while ((*cur == ' ') || (*cur == '\t')) cur++;
	    if (*cur == '\'') {
		cur++;
		argv[i] = cur;
		while ((*cur != 0) && (*cur != '\'')) cur++;
		if (*cur == '\'') {
		    *cur = 0;
		    nbargs++;
		    i++;
		    cur++;
		}
	    } else if (*cur == '"') {
		cur++;
		argv[i] = cur;
		while ((*cur != 0) && (*cur != '"')) cur++;
		if (*cur == '"') {
		    *cur = 0;
		    nbargs++;
		    i++;
		    cur++;
		}
	    } else {
		argv[i] = cur;
		while ((*cur != 0) && (*cur != ' ') && (*cur != '\t'))
		    cur++;
		*cur = 0;
		nbargs++;
		i++;
		cur++;
	    }
	}

	/*
	 * start interpreting the command
	 */
	if (!strcmp(command, "exit") ||
	    !strcmp(command, "quit") ||
	    !strcmp(command, "bye")) {
	    free(cmdline);
	    break;
	}

	if (!strcmp(command, "public")) {
	    if (nbargs != 1) {
		printf("public requires 1 arguments\n");
	    } else {
		ans = xmlCatalogResolvePublic((const xmlChar *) argv[0]);
		if (ans == NULL) {
		    printf("No entry for PUBLIC %s\n", argv[0]);
		} else {
		    printf("%s\n", (char *) ans);
		    xmlFree(ans);
		}
	    }
	} else if (!strcmp(command, "system")) {
	    if (nbargs != 1) {
		printf("system requires 1 arguments\n");
	    } else {
		ans = xmlCatalogResolveSystem((const xmlChar *) argv[0]);
		if (ans == NULL) {
		    printf("No entry for SYSTEM %s\n", argv[0]);
		} else {
		    printf("%s\n", (char *) ans);
		    xmlFree(ans);
		}
	    }
	} else if (!strcmp(command, "add")) {
	    if (sgml) {
		if ((nbargs != 3) && (nbargs != 2)) {
		    printf("add requires 2 or 3 arguments\n");
		} else {
		    if (argv[2] == NULL)
			ret = xmlCatalogAdd(BAD_CAST argv[0], NULL,
					    BAD_CAST argv[1]);
		    else
			ret = xmlCatalogAdd(BAD_CAST argv[0], BAD_CAST argv[1],
					    BAD_CAST argv[2]);
		    if (ret != 0)
			printf("add command failed\n");
		}
	    } else {
		if ((nbargs != 3) && (nbargs != 2)) {
		    printf("add requires 2 or 3 arguments\n");
		} else {
		    if (argv[2] == NULL)
			ret = xmlCatalogAdd(BAD_CAST argv[0], NULL,
					    BAD_CAST argv[1]);
		    else
			ret = xmlCatalogAdd(BAD_CAST argv[0], BAD_CAST argv[1],
					    BAD_CAST argv[2]);
		    if (ret != 0)
			printf("add command failed\n");
		}
	    }
	} else if (!strcmp(command, "del")) {
	    if (nbargs != 1) {
		printf("del requires 1\n");
	    } else {
		ret = xmlCatalogRemove(BAD_CAST argv[0]);
		if (ret <= 0)
		    printf("del command failed\n");

	    }
	} else if (!strcmp(command, "resolve")) {
	    if (nbargs != 2) {
		printf("resolve requires 2 arguments\n");
	    } else {
		ans = xmlCatalogResolve(BAD_CAST argv[0],
			                BAD_CAST argv[1]);
		if (ans == NULL) {
		    printf("Resolver failed to find an answer\n");
		} else {
		    printf("%s\n", (char *) ans);
		    xmlFree(ans);
		}
	    }
	} else if (!strcmp(command, "dump")) {
	    if (nbargs != 0) {
		printf("dump has no arguments\n");
	    } else {
		xmlCatalogDump(stdout);
	    }
	} else if (!strcmp(command, "debug")) {
	    if (nbargs != 0) {
		printf("debug has no arguments\n");
	    } else {
		verbose++;
		xmlCatalogSetDebug(verbose);
	    }
	} else if (!strcmp(command, "quiet")) {
	    if (nbargs != 0) {
		printf("quiet has no arguments\n");
	    } else {
		if (verbose > 0)
		    verbose--;
		xmlCatalogSetDebug(verbose);
	    }
	} else {
	    if (strcmp(command, "help")) {
		printf("Unrecognized command %s\n", command);
	    }
	    printf("Commands available:\n");
	    printf("\tpublic PublicID: make a PUBLIC identifier lookup\n");
	    printf("\tsystem SystemID: make a SYSTEM identifier lookup\n");
	    printf("\tresolve PublicID SystemID: do a full resolver lookup\n");
	    printf("\tadd 'type' 'orig' 'replace' : add an entry\n");
	    printf("\tdel 'values' : remove values\n");
	    printf("\tdump: print the current catalog state\n");
	    printf("\tdebug: increase the verbosity level\n");
	    printf("\tquiet: decrease the verbosity level\n");
	    printf("\texit:  quit the shell\n");
	}
	free(cmdline); /* not xmlFree here ! */
    }
}